

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

_Bool check_bitmap_from_range(uint32_t min,uint64_t max,uint32_t step)

{
  _Bool _Var1;
  byte bVar2;
  roaring_bitmap_t *r;
  uint32_t in_EDX;
  uint64_t in_RSI;
  uint in_EDI;
  _Bool is_equal;
  roaring_bitmap_t *unaff_retaddr;
  char *internal_reason_buf_1;
  char *internal_reason_buf;
  uint32_t value;
  roaring_bitmap_t *expected;
  roaring_bitmap_t *result;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *file;
  char *in_stack_ffffffffffffffc8;
  undefined8 uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff8;
  uint val;
  
  roaring_bitmap_from_range(CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI,in_EDX);
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  r = roaring_bitmap_create();
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  val = in_EDI;
  for (; in_EDI < in_RSI; in_EDI = in_EDX + in_EDI) {
    roaring_bitmap_add(unaff_retaddr,val);
  }
  uVar3 = 0;
  _Var1 = roaring_bitmap_internal_validate(r,(char **)CONCAT44(in_EDI,in_stack_ffffffffffffffd0));
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",uVar3);
    _fail(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  file = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(r,(char **)CONCAT44(in_EDI,in_stack_ffffffffffffffd0));
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",file);
    _fail(file,in_stack_ffffffffffffffbc);
  }
  bVar2 = roaring_bitmap_equals(r,(roaring_bitmap_t *)CONCAT44(in_EDI,in_stack_ffffffffffffffd0));
  if (!(bool)bVar2) {
    fprintf(_stderr,"[ERROR] check_bitmap_from_range(%u, %u, %u)\n",(ulong)val,in_RSI & 0xffffffff,
            (ulong)in_EDX);
  }
  roaring_bitmap_free((roaring_bitmap_t *)0x1063db);
  roaring_bitmap_free((roaring_bitmap_t *)0x1063e5);
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool check_bitmap_from_range(uint32_t min, uint64_t max, uint32_t step) {
    roaring_bitmap_t *result = roaring_bitmap_from_range(min, max, step);
    assert_non_null(result);
    roaring_bitmap_t *expected = roaring_bitmap_create();
    assert_non_null(expected);
    for (uint32_t value = min; value < max; value += step) {
        roaring_bitmap_add(expected, value);
    }
    assert_bitmap_validate(result);
    assert_bitmap_validate(expected);
    bool is_equal = roaring_bitmap_equals(expected, result);
    if (!is_equal) {
        fprintf(stderr, "[ERROR] check_bitmap_from_range(%u, %u, %u)\n",
                (unsigned)min, (unsigned)max, (unsigned)step);
    }
    roaring_bitmap_free(expected);
    roaring_bitmap_free(result);
    return is_equal;
}